

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_tri_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  REF_DBL RVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  REF_DBL e1 [3];
  REF_DBL e0 [3];
  REF_DBL det;
  REF_DBL jac [9];
  REF_DBL xyz2 [3];
  REF_DBL xyz1 [3];
  REF_DBL xyz0 [3];
  REF_DBL area;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  double local_228 [4];
  double local_208 [4];
  double local_1e8 [4];
  double local_1c8 [6];
  REF_DBL local_198 [10];
  REF_DBL local_148 [4];
  REF_DBL local_128 [4];
  REF_DBL local_108 [4];
  double local_e8 [6];
  double local_b8 [19];
  
  if (ref_node->tri_quality == 2) {
    iVar1 = *nodes;
    pRVar2 = ref_node->real;
    lVar5 = 0;
    do {
      local_b8[lVar5 + 0xc] = pRVar2[iVar1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    iVar1 = nodes[1];
    lVar5 = 0;
    do {
      local_b8[lVar5 + 6] = pRVar2[iVar1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    iVar1 = nodes[2];
    lVar5 = 0;
    do {
      local_b8[lVar5] = pRVar2[iVar1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    lVar5 = 0;
    do {
      auVar16._0_8_ = local_b8[lVar5 + 0xc] + local_b8[lVar5 + 6] + local_b8[lVar5];
      auVar16._8_8_ = local_b8[lVar5 + 0xd] + local_b8[lVar5 + 7] + local_b8[lVar5 + 1];
      auVar16 = divpd(auVar16,_DAT_00203460);
      *(undefined1 (*) [16])(local_1c8 + lVar5) = auVar16;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 6);
    uVar3 = ref_matrix_exp_m(local_1c8,local_e8);
    if (uVar3 == 0) {
      uVar3 = ref_matrix_jacob_m(local_e8,local_198);
      if (uVar3 == 0) {
        uVar3 = ref_matrix_vect_mult(local_198,ref_node->real + (long)*nodes * 0xf,local_108);
        if (uVar3 == 0) {
          uVar3 = ref_matrix_vect_mult(local_198,ref_node->real + (long)nodes[1] * 0xf,local_128);
          if (uVar3 == 0) {
            uVar3 = ref_matrix_vect_mult(local_198,ref_node->real + (long)nodes[2] * 0xf,local_148);
            if (uVar3 == 0) {
              lVar5 = 0;
              do {
                local_1e8[lVar5] = local_148[lVar5] - local_128[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              lVar5 = 0;
              do {
                local_208[lVar5] = local_108[lVar5] - local_148[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              lVar5 = 0;
              do {
                local_228[lVar5] = local_128[lVar5] - local_108[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              dVar9 = local_228[1] * local_1e8[2] - local_1e8[1] * local_228[2];
              dVar17 = local_228[2] * local_1e8[0] - local_1e8[2] * local_228[0];
              dVar18 = local_228[0] * local_1e8[1] - local_1e8[0] * local_228[1];
              dVar8 = local_228[2] * local_228[2] +
                      local_228[0] * local_228[0] + local_228[1] * local_228[1] +
                      local_208[2] * local_208[2] +
                      local_208[0] * local_208[0] + local_208[1] * local_208[1] +
                      local_1e8[2] * local_1e8[2] +
                      local_1e8[0] * local_1e8[0] + local_1e8[1] * local_1e8[1];
              dVar13 = dVar8 * 1e+20;
              dVar9 = SQRT(dVar18 * dVar18 + dVar9 * dVar9 + dVar17 * dVar17) * 0.5;
              auVar11._0_8_ = -dVar13;
              auVar11._8_8_ = -dVar9;
              auVar14._8_8_ = dVar9;
              auVar14._0_8_ = dVar13;
              auVar16 = maxpd(auVar14,auVar11);
              uVar7 = -(ulong)(auVar16._8_8_ < auVar16._0_8_);
              RVar10 = (REF_DBL)(~uVar7 & 0xbff0000000000000 |
                                (ulong)((dVar9 / dVar8) * 6.928203230275509) & uVar7);
LAB_0016caa8:
              *quality = RVar10;
              return 0;
            }
            pcVar6 = "xyz2";
            uVar4 = 0x7ed;
          }
          else {
            pcVar6 = "xyz1";
            uVar4 = 0x7eb;
          }
        }
        else {
          pcVar6 = "xyz0";
          uVar4 = 0x7e9;
        }
      }
      else {
        pcVar6 = "jac";
        uVar4 = 0x7e6;
      }
    }
    else {
      pcVar6 = "exp";
      uVar4 = 0x7e5;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_tri_jac_quality",(ulong)uVar3,pcVar6);
    uVar4 = 0x809;
  }
  else {
    if (ref_node->tri_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x80c,
             "ref_node_tri_quality","case not recognized");
      return 1;
    }
    uVar3 = ref_node_ratio(ref_node,*nodes,nodes[1],local_b8 + 0xc);
    if (uVar3 == 0) {
      uVar3 = ref_node_ratio(ref_node,*nodes,nodes[2],local_b8 + 6);
      if (uVar3 == 0) {
        uVar3 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_b8);
        if (uVar3 == 0) {
          uVar3 = ref_node_tri_area(ref_node,nodes,local_e8);
          if (uVar3 == 0) {
            iVar1 = *nodes;
            pRVar2 = ref_node->real;
            lVar5 = 0;
            do {
              local_198[lVar5] = pRVar2[iVar1 * 0xf + 3 + (int)lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 6);
            uVar3 = ref_matrix_det_m(local_198,local_1c8);
            dVar8 = local_1c8[0];
            if (uVar3 == 0) {
              iVar1 = nodes[1];
              pRVar2 = ref_node->real;
              lVar5 = 0;
              do {
                local_198[lVar5] = pRVar2[iVar1 * 0xf + 3 + (int)lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 6);
              uVar3 = ref_matrix_det_m(local_198,local_1c8);
              dVar9 = local_1c8[0];
              if (uVar3 == 0) {
                iVar1 = nodes[2];
                pRVar2 = ref_node->real;
                lVar5 = 0;
                do {
                  local_198[lVar5] = pRVar2[iVar1 * 0xf + 3 + (int)lVar5];
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 6);
                uVar3 = ref_matrix_det_m(local_198,local_1c8);
                if (uVar3 == 0) {
                  if (dVar9 <= dVar8) {
                    dVar8 = dVar9;
                  }
                  if (local_1c8[0] <= dVar8) {
                    dVar8 = local_1c8[0];
                  }
                  dVar8 = pow(dVar8,0.3333333333333333);
                  dVar13 = local_b8[0] * local_b8[0] +
                           local_b8[0xc] * local_b8[0xc] + local_b8[6] * local_b8[6];
                  dVar9 = dVar13 * 1e+20;
                  local_e8[0] = local_e8[0] * dVar8;
                  auVar12._0_8_ = -dVar9;
                  auVar12._8_8_ = -local_e8[0];
                  auVar15._8_8_ = local_e8[0];
                  auVar15._0_8_ = dVar9;
                  auVar16 = maxpd(auVar15,auVar12);
                  uVar7 = -(ulong)(auVar16._8_8_ < auVar16._0_8_);
                  RVar10 = (REF_DBL)(~uVar7 & 0xbff0000000000000 |
                                    (ulong)((local_e8[0] * 6.9282032302755105) / dVar13) & uVar7);
                  goto LAB_0016caa8;
                }
                pcVar6 = "n2";
                uVar4 = 0x7c5;
              }
              else {
                pcVar6 = "n1";
                uVar4 = 0x7c1;
              }
            }
            else {
              pcVar6 = "n0";
              uVar4 = 0x7bd;
            }
          }
          else {
            pcVar6 = "area";
            uVar4 = 0x7ba;
          }
        }
        else {
          pcVar6 = "l2";
          uVar4 = 0x7b8;
        }
      }
      else {
        pcVar6 = "l1";
        uVar4 = 0x7b7;
      }
    }
    else {
      pcVar6 = "l0";
      uVar4 = 0x7b6;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_tri_epic_quality",(ulong)uVar3,pcVar6);
    uVar4 = 0x806;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_tri_quality",(ulong)uVar3,"epic");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_quality(ref_node, nodes, quality), "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}